

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

void recff_string_format(jit_State *J,RecordFFData *rd)

{
  bool bVar1;
  TRef TVar2;
  TRef TVar3;
  SFormat k;
  GCobj *pGVar4;
  IRRef1 IVar5;
  long lVar6;
  IRRef1 IVar7;
  uint uVar8;
  int iVar9;
  IRCallID IVar10;
  FormatState fs;
  uint local_64;
  int local_60;
  FormatState local_50;
  
  TVar2 = lj_ir_tostr(J,*J->base);
  pGVar4 = (GCobj *)argv2str(J,rd->argv);
  TVar3 = lj_ir_kgc(J,pGVar4,IRT_STR);
  (J->fold).ins.field_0.ot = 0x884;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
  lj_opt_fold(J);
  TVar2 = lj_ir_kptr_(J,IR_KPTR,J[-1].penalty + 0x38);
  (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x53050000;
  TVar2 = lj_opt_fold(J);
  local_50.p = (uint8_t *)&(pGVar4->gch).metatable;
  local_50.e = (uint8_t *)((long)pGVar4 + (ulong)(pGVar4->str).len + 0x10);
  local_60 = 1;
  iVar9 = 0;
  local_64 = TVar2;
  do {
    k = lj_strfmt_parse(&local_50);
    IVar5 = (IRRef1)local_64;
    if (k == 2) {
      uVar8 = 0;
    }
    else {
      if (k == 0) {
        (J->fold).ins.field_0.ot = 0x5504;
        (J->fold).ins.field_0.op1 = IVar5;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
        TVar2 = lj_opt_fold(J);
        *J->base = TVar2;
        return;
      }
      lVar6 = (long)local_60;
      local_60 = local_60 + 1;
      uVar8 = J->base[lVar6];
    }
    TVar3 = lj_ir_kint(J,k);
    IVar7 = (IRRef1)uVar8;
    switch(k & 0xf) {
    case 2:
      pGVar4 = (GCobj *)lj_str_new(J->L,local_50.str,(ulong)local_50.len);
      TVar3 = lj_ir_kgc(J,pGVar4,IRT_STR);
      IVar7 = (IRRef1)TVar3;
LAB_0013dfba:
      (J->fold).ins.field_0.ot = 0x5405;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = IVar7;
      break;
    case 3:
      IVar10 = IRCALL_lj_strfmt_putfnum_int;
      goto LAB_0013df0a;
    case 4:
      IVar10 = IRCALL_lj_strfmt_putfnum_uint;
LAB_0013df0a:
      if ((uVar8 >> 0x18 & 0x1f) - 0xf < 5) {
        if (k != 3) {
          (J->fold).ins.field_0.op1 = IVar7;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x59160ad3;
          uVar8 = lj_opt_fold(J);
          IVar10 = IRCALL_lj_strfmt_putfxint;
          goto LAB_0013df72;
        }
        (J->fold).ins.field_0.op1 = IVar7;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b040000;
        TVar3 = lj_opt_fold(J);
        (J->fold).ins.field_0.ot = 0x5405;
        (J->fold).ins.field_0.op1 = IVar5;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
        local_64 = lj_opt_fold(J);
      }
      else {
LAB_0013df62:
        uVar8 = lj_ir_tonum(J,uVar8);
LAB_0013df72:
        local_64 = lj_ir_call(J,IVar10,(ulong)local_64,(ulong)TVar3,(ulong)uVar8);
      }
      goto LAB_0013e03c;
    case 5:
      IVar10 = IRCALL_lj_strfmt_putfnum;
      goto LAB_0013df62;
    case 6:
      if ((uVar8 & 0x1f000000) != 0x4000000) goto switchD_0013de7f_default;
      if (k != 6) {
        if ((k & 0x10) == 0) {
          IVar10 = IRCALL_lj_strfmt_putfstr;
          goto LAB_0013e031;
        }
        local_64 = lj_ir_call(J,IRCALL_lj_strfmt_putquoted,(ulong)local_64,(ulong)uVar8);
        goto LAB_0013e03c;
      }
      (J->fold).ins.field_0.ot = 0x5405;
      (J->fold).ins.field_0.op1 = IVar5;
      (J->fold).ins.field_0.op2 = IVar7;
      break;
    case 7:
      uVar8 = lj_opt_narrow_toint(J,uVar8);
      if (k == 7) {
        (J->fold).ins.field_0.op1 = (IRRef1)uVar8;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b040002;
        TVar3 = lj_opt_fold(J);
        IVar7 = (IRRef1)TVar3;
        goto LAB_0013dfba;
      }
      IVar10 = IRCALL_lj_strfmt_putfchar;
LAB_0013e031:
      local_64 = lj_ir_call(J,IVar10,(ulong)local_64,(ulong)TVar3,(ulong)uVar8);
      goto LAB_0013e03c;
    default:
switchD_0013de7f_default:
      recff_nyi(J,rd);
      bVar1 = false;
      goto LAB_0013e047;
    }
    local_64 = lj_opt_fold(J);
LAB_0013e03c:
    if (99 < iVar9) {
      lj_trace_err(J,LJ_TRERR_TRACEOV);
    }
    iVar9 = iVar9 + 1;
    bVar1 = true;
LAB_0013e047:
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

static void LJ_FASTCALL recff_string_format(jit_State *J, RecordFFData *rd)
{
  TRef trfmt = lj_ir_tostr(J, J->base[0]);
  GCstr *fmt = argv2str(J, &rd->argv[0]);
  int arg = 1;
  TRef hdr, tr;
  FormatState fs;
  SFormat sf;
  int nfmt = 0;
  /* Specialize to the format string. */
  emitir(IRTG(IR_EQ, IRT_STR), trfmt, lj_ir_kstr(J, fmt));
  tr = hdr = recff_bufhdr(J);
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {  /* Parse format. */
    TRef tra = sf == STRFMT_LIT ? 0 : J->base[arg++];
    TRef trsf = lj_ir_kint(J, (int32_t)sf);
    IRCallID id;
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		  lj_ir_kstr(J, lj_str_new(J->L, fs.str, fs.len)));
      break;
    case STRFMT_INT:
      id = IRCALL_lj_strfmt_putfnum_int;
    handle_int:
      if (!tref_isinteger(tra))
	goto handle_num;
      if (sf == STRFMT_INT) { /* Shortcut for plain %d. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_INT));
      } else {
#if LJ_HASFFI
	tra = emitir(IRT(IR_CONV, IRT_U64), tra,
		     (IRT_INT|(IRT_U64<<5)|IRCONV_SEXT));
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	lj_needsplit(J);
#else
	recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
	return;
#endif
      }
      break;
    case STRFMT_UINT:
      id = IRCALL_lj_strfmt_putfnum_uint;
      goto handle_int;
    case STRFMT_NUM:
      id = IRCALL_lj_strfmt_putfnum;
    handle_num:
      tra = lj_ir_tonum(J, tra);
      tr = lj_ir_call(J, id, tr, trsf, tra);
      if (LJ_SOFTFP32) lj_needsplit(J);
      break;
    case STRFMT_STR:
      if (!tref_isstr(tra)) {
	recff_nyiu(J, rd);  /* NYI: __tostring and non-string types for %s. */
	return;
      }
      if (sf == STRFMT_STR)  /* Shortcut for plain %s. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, tra);
      else if ((sf & STRFMT_T_QUOTED))
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putquoted, tr, tra);
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfstr, tr, trsf, tra);
      break;
    case STRFMT_CHAR:
      tra = lj_opt_narrow_toint(J, tra);
      if (sf == STRFMT_CHAR)  /* Shortcut for plain %c. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_CHAR));
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfchar, tr, trsf, tra);
      break;
    case STRFMT_PTR:  /* NYI */
    case STRFMT_ERR:
    default:
      recff_nyiu(J, rd);
      return;
    }
    if (++nfmt > 100) lj_trace_err(J, LJ_TRERR_TRACEOV);
  }
  J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
}